

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EventControlWithExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventControlWithExpressionSyntax,slang::syntax::EventControlWithExpressionSyntax_const&>
          (BumpAllocator *this,EventControlWithExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  EventExpressionSyntax *pEVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  EventControlWithExpressionSyntax *pEVar10;
  
  pEVar10 = (EventControlWithExpressionSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_TimingControlSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_TimingControlSyntax).super_SyntaxNode.previewNode;
  TVar6 = (args->at).kind;
  uVar7 = (args->at).field_0x2;
  NVar8.raw = (args->at).numFlags.raw;
  uVar9 = (args->at).rawLen;
  pIVar3 = (args->at).info;
  pEVar4 = (args->expr).ptr;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.kind =
       (args->super_TimingControlSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar10->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.parent = pSVar1;
  (pEVar10->super_TimingControlSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pEVar10->at).kind = TVar6;
  (pEVar10->at).field_0x2 = uVar7;
  (pEVar10->at).numFlags = (NumericTokenFlags)NVar8.raw;
  (pEVar10->at).rawLen = uVar9;
  (pEVar10->at).info = pIVar3;
  (pEVar10->expr).ptr = pEVar4;
  return pEVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }